

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::valid_boolean_property
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,c_string *tname,c_string *pname
          )

{
  const_iterator cVar1;
  const_iterator cVar2;
  
  cVar1 = std::
          _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
          ::find(&(this->tags)._M_t,tname);
  if (((_Rb_tree_header *)cVar1._M_node != &(this->tags)._M_t._M_impl.super__Rb_tree_header) &&
     (cVar2 = std::
              _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
              ::find((_Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                      *)&cVar1._M_node[2]._M_left,pname),
     cVar2._M_node != (_Base_ptr)&cVar1._M_node[2]._M_right)) {
    return *(long *)(cVar2._M_node + 3) == 0;
  }
  return false;
}

Assistant:

bool valid_boolean_property(c_string const &tname,c_string const &pname) const
		{
			if(IsXHTML) 
				return false;
			typename tags_type::const_iterator pt = tags.find(tname);
			if(pt==tags.end())
				return false;
			typename properties_type::const_iterator pp = pt->second.properties.find(pname);
			if(pp == pt->second.properties.end())
				return false;
			if(pp->second == nullptr)
				return true;
			return false;
		}